

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

EulerAngles *
AML::eulerAngleKinematicRates
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,Vector3 *bodyRates)

{
  Matrix33 local_4b8;
  anon_union_24_2_4720223f_for_Vector3_0 local_470;
  Matrix33 local_458;
  anon_union_24_2_4720223f_for_Vector3_0 local_410;
  Matrix33 local_3f8;
  anon_union_24_2_4720223f_for_Vector3_0 local_3b0;
  Matrix33 local_398;
  anon_union_24_2_4720223f_for_Vector3_0 local_350;
  Matrix33 local_338;
  anon_union_24_2_4720223f_for_Vector3_0 local_2f0;
  Matrix33 local_2d8;
  anon_union_24_2_4720223f_for_Vector3_0 local_290;
  Matrix33 local_278;
  anon_union_24_2_4720223f_for_Vector3_0 local_230;
  Matrix33 local_218;
  anon_union_24_2_4720223f_for_Vector3_0 local_1d0;
  Matrix33 local_1b8;
  anon_union_24_2_4720223f_for_Vector3_0 local_170;
  Matrix33 local_158;
  anon_union_24_2_4720223f_for_Vector3_0 local_110;
  Matrix33 local_f8;
  anon_union_24_2_4720223f_for_Vector3_0 local_b0;
  Matrix33 local_98;
  anon_union_24_2_4720223f_for_Vector3_0 local_50;
  EulerSequence local_34;
  undefined1 auStack_30 [4];
  EulerSequence seq;
  Vector3 eulerRates;
  Vector3 *bodyRates_local;
  EulerAngles *angles_local;
  
  eulerRates.field_0.data[2] = (double)bodyRates;
  Vector3::Vector3((Vector3 *)auStack_30);
  local_34 = EulerAngles::getEulerSequence(angles);
  switch(local_34) {
  case ZXZ:
    eulerAngleRatesMatrix_ZXZ(&local_f8,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_b0.field_1,&local_f8,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_b0.data[0];
    eulerRates.field_0.data[0] = local_b0.data[1];
    eulerRates.field_0.data[1] = local_b0.data[2];
    break;
  case XYX:
    eulerAngleRatesMatrix_XYX(&local_1b8,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_170.field_1,&local_1b8,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_170.data[0];
    eulerRates.field_0.data[0] = local_170.data[1];
    eulerRates.field_0.data[1] = local_170.data[2];
    break;
  case YZY:
    eulerAngleRatesMatrix_YZY(&local_158,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_110.field_1,&local_158,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_110.data[0];
    eulerRates.field_0.data[0] = local_110.data[1];
    eulerRates.field_0.data[1] = local_110.data[2];
    break;
  case ZYZ:
    eulerAngleRatesMatrix_ZYZ(&local_218,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_1d0.field_1,&local_218,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_1d0.data[0];
    eulerRates.field_0.data[0] = local_1d0.data[1];
    eulerRates.field_0.data[1] = local_1d0.data[2];
    break;
  case XZX:
    eulerAngleRatesMatrix_XZX(&local_278,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_230.field_1,&local_278,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_230.data[0];
    eulerRates.field_0.data[0] = local_230.data[1];
    eulerRates.field_0.data[1] = local_230.data[2];
    break;
  case YXY:
    eulerAngleRatesMatrix_YXY(&local_2d8,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_290.field_1,&local_2d8,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_290.data[0];
    eulerRates.field_0.data[0] = local_290.data[1];
    eulerRates.field_0.data[1] = local_290.data[2];
    break;
  case XYZ:
    eulerAngleRatesMatrix_XYZ(&local_98,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_50.field_1,&local_98,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_50.data[0];
    eulerRates.field_0.data[0] = local_50.data[1];
    eulerRates.field_0.data[1] = local_50.data[2];
    break;
  case YZX:
    eulerAngleRatesMatrix_YZX(&local_338,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_2f0.field_1,&local_338,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_2f0.data[0];
    eulerRates.field_0.data[0] = local_2f0.data[1];
    eulerRates.field_0.data[1] = local_2f0.data[2];
    break;
  case ZXY:
    eulerAngleRatesMatrix_ZXY(&local_398,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_350.field_1,&local_398,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_350.data[0];
    eulerRates.field_0.data[0] = local_350.data[1];
    eulerRates.field_0.data[1] = local_350.data[2];
    break;
  case XZY:
    eulerAngleRatesMatrix_XZY(&local_3f8,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_3b0.field_1,&local_3f8,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_3b0.data[0];
    eulerRates.field_0.data[0] = local_3b0.data[1];
    eulerRates.field_0.data[1] = local_3b0.data[2];
    break;
  case ZYX:
    eulerAngleRatesMatrix_ZYX(&local_458,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_410.field_1,&local_458,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_410.data[0];
    eulerRates.field_0.data[0] = local_410.data[1];
    eulerRates.field_0.data[1] = local_410.data[2];
    break;
  case YXZ:
    eulerAngleRatesMatrix_YXZ(&local_4b8,angles->phi,angles->theta,angles->psi);
    operator*((Vector3 *)&local_470.field_1,&local_4b8,(Vector3 *)eulerRates.field_0.data[2]);
    _auStack_30 = local_470.data[0];
    eulerRates.field_0.data[0] = local_470.data[1];
    eulerRates.field_0.data[1] = local_470.data[2];
  }
  EulerAngles::EulerAngles
            (__return_storage_ptr__,(double)_auStack_30,eulerRates.field_0.data[0],
             eulerRates.field_0.data[1],local_34);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles eulerAngleKinematicRates(const EulerAngles& angles, const Vector3& bodyRates)
    {
        Vector3 eulerRates;
        EulerAngles::EulerSequence seq = angles.getEulerSequence();
        switch (seq)
        {
        case EulerAngles::EulerSequence::XYZ:
            eulerRates = eulerAngleRatesMatrix_XYZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZXZ:
            eulerRates = eulerAngleRatesMatrix_ZXZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YZY:
            eulerRates = eulerAngleRatesMatrix_YZY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::XYX:
            eulerRates = eulerAngleRatesMatrix_XYX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZYZ:
            eulerRates = eulerAngleRatesMatrix_ZYZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::XZX:
            eulerRates = eulerAngleRatesMatrix_XZX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YXY:
            eulerRates = eulerAngleRatesMatrix_YXY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YZX:
            eulerRates = eulerAngleRatesMatrix_YZX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZXY:
            eulerRates = eulerAngleRatesMatrix_ZXY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::XZY:
            eulerRates = eulerAngleRatesMatrix_XZY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZYX:
            eulerRates = eulerAngleRatesMatrix_ZYX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YXZ:
            eulerRates = eulerAngleRatesMatrix_YXZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        }
        return EulerAngles(eulerRates.x, eulerRates.y, eulerRates.z, seq);
    }